

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O1

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::assign(WorkData *this,uint32_t varId,uint32_t regId)

{
  uint uVar1;
  
  if (regId < 0x20) {
    uVar1 = this->_assignedRegs;
    if ((uVar1 >> (regId & 0x1f) & 1) == 0) {
      if (this->_physToVarId[regId] == 0xff) {
        this->_physToVarId[regId] = (uint8_t)varId;
        this->_assignedRegs = uVar1 ^ 1 << ((byte)regId & 0x1f);
        return;
      }
      goto LAB_0011de2b;
    }
  }
  else {
    assign();
  }
  assign();
LAB_0011de2b:
  assign();
  return;
}

Assistant:

inline void assign(uint32_t varId, uint32_t regId) noexcept {
      ASMJIT_ASSERT(!isAssigned(regId));
      ASMJIT_ASSERT(_physToVarId[regId] == kVarIdNone);

      _physToVarId[regId] = uint8_t(varId);
      _assignedRegs ^= Support::bitMask(regId);
    }